

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_pit_mon_base(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *name;
  monster_base *pmVar3;
  undefined8 *puVar4;
  
  pvVar2 = parser_priv(p);
  name = parser_getsym(p,"base");
  pmVar3 = lookup_monster_base(name);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (pmVar3 == (monster_base *)0x0) {
    pVar1 = PARSE_ERROR_UNRECOGNISED_TVAL;
  }
  else {
    puVar4 = (undefined8 *)mem_zalloc(0x10);
    puVar4[1] = pmVar3;
    *puVar4 = *(undefined8 *)((long)pvVar2 + 0x60);
    *(undefined8 **)((long)pvVar2 + 0x60) = puVar4;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_pit_mon_base(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	struct pit_monster_profile *bases;
	struct monster_base *base = lookup_monster_base(parser_getsym(p, "base"));

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	else if (!base)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	bases = mem_zalloc(sizeof *bases);
	bases->base = base;
	bases->next = pit->bases;
	pit->bases = bases;
	return PARSE_ERROR_NONE;
}